

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinclude.c
# Opt level: O0

int xmlXIncludeProcessNode(xmlXIncludeCtxtPtr ctxt,xmlNodePtr node)

{
  int local_24;
  int ret;
  xmlNodePtr node_local;
  xmlXIncludeCtxtPtr ctxt_local;
  
  if ((((node == (xmlNodePtr)0x0) || (node->type == XML_NAMESPACE_DECL)) ||
      (node->doc == (_xmlDoc *)0x0)) || (ctxt == (xmlXIncludeCtxtPtr)0x0)) {
    ctxt_local._4_4_ = -1;
  }
  else {
    local_24 = xmlXIncludeDoProcessRoot(ctxt,node);
    if ((-1 < local_24) && (0 < ctxt->nbErrors)) {
      local_24 = -1;
    }
    ctxt_local._4_4_ = local_24;
  }
  return ctxt_local._4_4_;
}

Assistant:

int
xmlXIncludeProcessNode(xmlXIncludeCtxtPtr ctxt, xmlNodePtr node) {
    int ret = 0;

    if ((node == NULL) || (node->type == XML_NAMESPACE_DECL) ||
        (node->doc == NULL) || (ctxt == NULL))
	return(-1);
    ret = xmlXIncludeDoProcessRoot(ctxt, node);
    if ((ret >= 0) && (ctxt->nbErrors > 0))
	ret = -1;
    return(ret);
}